

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O3

prog_chunk * __thiscall
mvm::assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer>::assemble
          (prog_chunk *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this,istream *stream)

{
  char cVar1;
  istream *piVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> line_assembly;
  string line;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  (__return_storage_ptr__->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_50,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    assemble(&local_68,this,&local_50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->code).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

prog_chunk assembler<Set, MetaCodeImpl>::assemble(std::istream &stream) const {
  prog_chunk c;
  std::string line;
  while (std::getline(stream, line)) {
    auto line_assembly = assemble(line);
    c.code.insert(std::end(c.code), std::cbegin(line_assembly),
                  std::cend(line_assembly));
  }

  return c;
}